

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resumable_io.c
# Opt level: O2

Qiniu_Error
Qiniu_Rio_bput(Qiniu_Client *self,Qiniu_Rio_BlkputRet *ret,Qiniu_Reader body,int bodyLength,
              char *url,_Qiniu_Progress_Callback_Data_conflict *progressCallback)

{
  Qiniu_Uint32 QVar1;
  char *pcVar2;
  char *pcVar3;
  code *callback;
  Qiniu_Error QVar4;
  Qiniu_Json *root;
  Qiniu_Rio_BlkputRet retFromResp;
  
  if (progressCallback == (_Qiniu_Progress_Callback_Data_conflict *)0x0) {
    callback = (_func_int_void_ptr_double_double_double_double *)0x0;
    progressCallback = (_Qiniu_Progress_Callback_Data_conflict *)0x0;
  }
  else {
    callback = _Qiniu_Progress_Callback;
    if (progressCallback->callback == (_func_void_size_t_size_t *)0x0) {
      progressCallback = (_Qiniu_Progress_Callback_Data_conflict *)0x0;
      callback = (_func_int_void_ptr_double_double_double_double *)0x0;
    }
  }
  QVar4 = Qiniu_Client_CallWithBinaryAndProgressCallback
                    (self,&root,url,body,(long)bodyLength,(char *)0x0,callback,progressCallback);
  if (QVar4.code == 200) {
    pcVar2 = Qiniu_Json_GetString(root,"ctx",(char *)0x0);
    retFromResp.ctx = pcVar2;
    retFromResp.checksum = Qiniu_Json_GetString(root,"checksum",(char *)0x0);
    pcVar3 = Qiniu_Json_GetString(root,"host",(char *)0x0);
    retFromResp.host = pcVar3;
    retFromResp.crc32 = Qiniu_Json_GetUInt32(root,"crc32",0);
    QVar1 = Qiniu_Json_GetUInt32(root,"offset",0);
    retFromResp.offset = QVar1;
    retFromResp.expiredAt = Qiniu_Json_GetUInt64(root,"expired_at",0);
    if (QVar1 == 0 || (pcVar3 == (char *)0x0 || pcVar2 == (char *)0x0)) {
      QVar4.message = "unexpected response: invalid ctx, host or offset";
      QVar4._0_8_ = 0x270e;
    }
    else {
      Qiniu_Rio_BlkputRet_Assign(ret,&retFromResp);
      QVar4.message = QVar4.message;
      QVar4._0_8_ = 200;
    }
  }
  return QVar4;
}

Assistant:

static Qiniu_Error Qiniu_Rio_bput(Qiniu_Client *self, Qiniu_Rio_BlkputRet *ret, Qiniu_Reader body, int bodyLength, const char *url, struct _Qiniu_Progress_Callback_Data *progressCallback)
{
    Qiniu_Rio_BlkputRet retFromResp;
    Qiniu_Json *root;
    int (*callback)(void *, double, double, double, double) = NULL;
    void *callbackData = NULL;
    if (progressCallback != NULL && progressCallback->callback != NULL)
    {
        callback = _Qiniu_Progress_Callback;
        callbackData = (void *)progressCallback;
    }

    Qiniu_Error err = Qiniu_Client_CallWithBinaryAndProgressCallback(self, &root, url, body, bodyLength, NULL, callback, callbackData);
    if (err.code == 200)
    {
        retFromResp.ctx = Qiniu_Json_GetString(root, "ctx", NULL);
        retFromResp.checksum = Qiniu_Json_GetString(root, "checksum", NULL);
        retFromResp.host = Qiniu_Json_GetString(root, "host", NULL);
        retFromResp.crc32 = Qiniu_Json_GetUInt32(root, "crc32", 0);
        retFromResp.offset = Qiniu_Json_GetUInt32(root, "offset", 0);
        retFromResp.expiredAt = Qiniu_Json_GetUInt64(root, "expired_at", 0);

        if (retFromResp.ctx == NULL || retFromResp.host == NULL || retFromResp.offset == 0)
        {
            err.code = 9998;
            err.message = "unexpected response: invalid ctx, host or offset";
            return err;
        }

        Qiniu_Rio_BlkputRet_Assign(ret, &retFromResp);
    }

    return err;
}